

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O2

void __thiscall
TEST_MockFailureTest_MockUnexpectedObjectFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedObjectFailure_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString local_a0;
  undefined1 local_90 [16];
  MockUnexpectedObjectFailure failure;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)&failure,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)&failure);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar2),2);
  SimpleString::~SimpleString((SimpleString *)&failure);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)&failure,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)&failure);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x120))
            ((long *)CONCAT44(extraout_var_00,iVar2),3);
  SimpleString::~SimpleString((SimpleString *)&failure);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  (*(((this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3a])();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&failure,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,(SimpleString *)&failure);
  SimpleString::~SimpleString((SimpleString *)&failure);
  TEST_GROUP_CppUTestGroupMockFailureTest::addThreeCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_a0,"foo");
  MockUnexpectedObjectFailure::MockUnexpectedObjectFailure
            (&failure,pUVar3,&local_a0,(void *)0x1,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString(&local_a0);
  pUVar3 = UtestShell::getCurrent();
  StringFromFormat((char *)&local_a0,
                   "MockFailure: Function called on an unexpected object: foo\n\tActual object for call has address: <%p>\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 1 time)"
                   ,1,2,3);
  pcVar4 = SimpleString::asCharString(&local_a0);
  TestFailure::getMessage((TestFailure *)local_90);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_90);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,pcVar4,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0x12d,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_90);
  SimpleString::~SimpleString(&local_a0);
  TestFailure::~TestFailure((TestFailure *)&failure);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedObjectFailure)
{
    call1->withName("foo").onObject((void*) 0x02);
    call2->withName("foo").onObject((void*) 0x03);
    call2->callWasMade(1);
    call2->wasPassedToObject();
    call3->withName("unrelated");
    addThreeCallsToList();

    MockUnexpectedObjectFailure failure(UtestShell::getCurrent(), "foo", (void*)0x1, *list);
    STRCMP_EQUAL(StringFromFormat (
                 "MockFailure: Function called on an unexpected object: foo\n"
                 "\tActual object for call has address: <%p>\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 1 time)",
                 (void*) 0x01, (void*) 0x02, (void*) 0x03).asCharString(), failure.getMessage().asCharString());
}